

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode_machine.hpp
# Opt level: O2

void randomx::BytecodeMachine::exe_ISMULH_M
               (InstructionByteCode *ibc,int *pc,uint8_t *scratchpad,ProgramConfiguration *config)

{
  int_reg_t iVar1;
  
  iVar1 = smulh(*(ibc->field_0).idst,
                *(int64_t *)
                 (scratchpad + (*(int *)&ibc->field_2 + (int)*(ibc->field_1).isrc & ibc->memMask)));
  *(ibc->field_0).idst = iVar1;
  return;
}

Assistant:

static void exe_ISMULH_M(RANDOMX_EXE_ARGS) {
			*ibc.idst = smulh(unsigned64ToSigned2sCompl(*ibc.idst), unsigned64ToSigned2sCompl(load64(getScratchpadAddress(ibc, scratchpad))));
		}